

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refmap.c
# Opt level: O2

flatcc_refmap_ref_t flatcc_refmap_find(flatcc_refmap_t *refmap,void *src)

{
  size_t sVar1;
  flatcc_refmap_item *pfVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  flatcc_refmap_ref_t fVar6;
  
  fVar6 = 0;
  if (refmap->count != 0) {
    sVar1 = refmap->buckets;
    pfVar2 = refmap->table;
    uVar4 = _flatcc_refmap_hash(src);
    do {
      uVar5 = uVar4 & sVar1 - 1;
      pvVar3 = pfVar2[uVar5].src;
      if (pvVar3 == (void *)0x0) {
        return 0;
      }
      uVar4 = uVar4 + 1;
    } while (pvVar3 != src);
    fVar6 = pfVar2[uVar5].ref;
  }
  return fVar6;
}

Assistant:

flatcc_refmap_ref_t flatcc_refmap_find(flatcc_refmap_t *refmap, const void *src)
{
    struct flatcc_refmap_item *T;
    size_t N, i, j, k;

    if (refmap->count == 0) {
        return flatcc_refmap_not_found;
    }
    T = refmap->table;
    N = refmap->buckets - 1;
    k = _flatcc_refmap_hash(src);
    i = 0;
    j = _flatcc_refmap_probe(k, i, N);
    while (T[j].src) {
        if (T[j].src == src) return T[j].ref;
        ++i;
        j = _flatcc_refmap_probe(k, i, N);
    }
    return flatcc_refmap_not_found;
}